

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_reader.cc
# Opt level: O0

bool __thiscall leveldb::log::Reader::SkipToInitialBlock(Reader *this)

{
  bool bVar1;
  Reader *this_00;
  undefined8 *in_RDI;
  Status skip_status;
  uint64_t block_start_location;
  size_t offset_in_block;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint uVar2;
  Status in_stack_ffffffffffffffd8;
  byte local_1;
  
  this_00 = (Reader *)(in_RDI[9] - (in_RDI[9] & 0x7fff));
  if (0x7ffa < (in_RDI[9] & 0x7fff)) {
    this_00 = (Reader *)&this_00[0x174].buffer_;
  }
  in_RDI[8] = this_00;
  if (this_00 != (Reader *)0x0) {
    (**(code **)(*(long *)*in_RDI + 0x18))(&stack0xffffffffffffffd8,(long *)*in_RDI,this_00);
    bVar1 = Status::ok((Status *)&stack0xffffffffffffffd8);
    if (!bVar1) {
      ReportDrop(this_00,(uint64_t)in_stack_ffffffffffffffd8.state_,
                 (Status *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      local_1 = 0;
    }
    uVar2 = (uint)!bVar1;
    Status::~Status((Status *)(ulong)CONCAT14(!bVar1,in_stack_ffffffffffffffd0));
    if (uVar2 != 0) goto LAB_001210ec;
  }
  local_1 = 1;
LAB_001210ec:
  return (bool)(local_1 & 1);
}

Assistant:

bool Reader::SkipToInitialBlock() {
  const size_t offset_in_block = initial_offset_ % kBlockSize;
  uint64_t block_start_location = initial_offset_ - offset_in_block;

  // Don't search a block if we'd be in the trailer
  if (offset_in_block > kBlockSize - 6) {
    block_start_location += kBlockSize;
  }

  end_of_buffer_offset_ = block_start_location;

  // Skip to start of first block that can contain the initial record
  if (block_start_location > 0) {
    Status skip_status = file_->Skip(block_start_location);
    if (!skip_status.ok()) {
      ReportDrop((long)block_start_location, skip_status);
      return false;
    }
  }

  return true;
}